

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::
    reduction<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_d,bool reduce_c,
              bool post_process,float coeff,int keepdims,Option *opt)

{
  int iVar1;
  float in_XMM1_Da;
  byte in_stack_00000008;
  int ret;
  undefined4 in_stack_0000005c;
  Mat *in_stack_00000068;
  bool in_stack_00002038;
  bool in_stack_00002039;
  bool in_stack_0000203a;
  bool in_stack_0000203b;
  float in_stack_0000203c;
  Mat *in_stack_00002040;
  Mat *in_stack_00002048;
  int in_stack_00004da0;
  Option *in_stack_00004da8;
  int local_4;
  
  iVar1 = reduction_op<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>>
                    (in_stack_00002048,in_stack_00002040,in_stack_0000203c,in_stack_0000203b,
                     in_stack_0000203a,in_stack_00002039,in_stack_00002038,in_stack_00004da0,
                     in_stack_00004da8);
  if (iVar1 == 0) {
    if ((((in_stack_00000008 & 1) == 0) && (ABS(in_XMM1_Da - 1.0) <= 1.1920929e-07)) ||
       (iVar1 = reduction_post_process<ncnn::post_process_identity<float>>
                          (in_stack_00000068,opt._4_4_,
                           (Option *)CONCAT44(in_stack_0000005c,keepdims)), iVar1 == 0)) {
      local_4 = 0;
    }
    else {
      local_4 = -100;
    }
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_d, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabsf(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }

    return 0;
}